

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# figures.cpp
# Opt level: O0

void __thiscall agge::rounded_rectangle::setup_bezier(rounded_rectangle *this,uint state)

{
  real_t k_;
  uint state_local;
  rounded_rectangle *this_local;
  
  switch(state) {
  case 0:
    this->_xb = this->_points[0].x;
    this->_yb = this->_points[0].y + this->_ry;
    this->_xc1 = this->_points[0].x;
    this->_yc1 = this->_ry * 0.44808495 + this->_points[0].y;
    this->_xc2 = this->_rx * 0.44808495 + this->_points[0].x;
    this->_yc2 = this->_points[0].y;
    this->_xe = this->_points[0].x + this->_rx;
    this->_ye = this->_points[0].y;
    break;
  case 2:
    this->_xb = this->_points[1].x - this->_rx;
    this->_yb = this->_points[0].y;
    this->_xc1 = this->_rx * -0.44808495 + this->_points[1].x;
    this->_yc1 = this->_points[0].y;
    this->_xc2 = this->_points[1].x;
    this->_yc2 = this->_ry * 0.44808495 + this->_points[0].y;
    this->_xe = this->_points[1].x;
    this->_ye = this->_points[0].y + this->_rx;
    break;
  case 4:
    this->_xb = this->_points[0].x + this->_rx;
    this->_yb = this->_points[1].y;
    this->_xc1 = this->_rx * 0.44808495 + this->_points[0].x;
    this->_yc1 = this->_points[1].y;
    this->_xc2 = this->_points[0].x;
    this->_yc2 = this->_ry * -0.44808495 + this->_points[1].y;
    this->_xe = this->_points[0].x;
    this->_ye = this->_points[1].y - this->_ry;
    break;
  case 6:
    this->_xb = this->_points[1].x;
    this->_yb = this->_points[1].y - this->_ry;
    this->_xc1 = this->_points[1].x;
    this->_yc1 = this->_ry * -0.44808495 + this->_points[1].y;
    this->_xc2 = this->_rx * -0.44808495 + this->_points[1].x;
    this->_yc2 = this->_points[1].y;
    this->_xe = this->_points[1].x - this->_rx;
    this->_ye = this->_points[1].y;
  }
  this->_t = 0.0;
  return;
}

Assistant:

void rounded_rectangle::setup_bezier(unsigned state)
	{
		const real_t k_ = 1.0f - c_qarc_bezier_k;

		switch (state)
		{
		case left | top:
			_xb = _points[0].x, _yb = _points[0].y + _ry;
			_xc1 = _points[0].x, _yc1 = _points[0].y + k_ * _ry;
			_xc2 = _points[0].x + k_ * _rx, _yc2 = _points[0].y;
			_xe = _points[0].x + _rx, _ye = _points[0].y;
			break;

		case right | top:
			_xb = _points[1].x - _rx, _yb = _points[0].y;
			_xc1 = _points[1].x - k_ * _rx, _yc1 = _points[0].y;
			_xc2 = _points[1].x, _yc2 = _points[0].y + k_ * _ry;
			_xe = _points[1].x, _ye = _points[0].y + _rx;
			break;

		case right | bottom:
			_xb = _points[1].x, _yb = _points[1].y - _ry;
			_xc1 = _points[1].x, _yc1 = _points[1].y - k_ * _ry;
			_xc2 = _points[1].x - k_ * _rx, _yc2 = _points[1].y;
			_xe = _points[1].x - _rx, _ye = _points[1].y;
			break;

		case left | bottom:
			_xb = _points[0].x + _rx, _yb = _points[1].y;
			_xc1 = _points[0].x + k_ * _rx, _yc1 = _points[1].y;
			_xc2 = _points[0].x, _yc2 = _points[1].y - k_ * _ry;
			_xe = _points[0].x, _ye = _points[1].y - _ry;
			break;
		}
		_t = 0.0f;
	}